

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::dropEvent(MidiPlayerDialog *this,QDropEvent *e)

{
  QPoint *pQVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  QRect *pQVar6;
  long lVar7;
  int dropRow;
  QListWidgetItem *dropItem;
  undefined1 auStack_70 [7];
  bool dropToMidiList;
  qreal local_68;
  QPoint local_60;
  QPoint pos;
  QList<QUrl> local_48;
  undefined1 local_30 [8];
  QStringList fileNames;
  QDropEvent *e_local;
  MidiPlayerDialog *this_local;
  
  fileNames.d.size = (qsizetype)e;
  bVar3 = QEvent::isAccepted((QEvent *)e);
  if (!bVar3) {
    Master::isSupportedDropEvent((QDropEvent *)fileNames.d.size);
    bVar3 = QEvent::isAccepted((QEvent *)fileNames.d.size);
    if (!bVar3) {
      return;
    }
  }
  QDropEvent::mimeData((QDropEvent *)fileNames.d.size);
  QMimeData::urls();
  Master::parseMidiListFromUrls((QStringList *)local_30,&local_48);
  QList<QUrl>::~QList(&local_48);
  bVar3 = QList<QString>::isEmpty((QList<QString> *)local_30);
  if (bVar3) {
    QEvent::ignore((QEvent *)fileNames.d.size);
    pos.xp = 1;
  }
  else {
    _auStack_70 = QDropEvent::position((QDropEvent *)fileNames.d.size);
    local_60 = QPointF::toPoint((QPointF *)auStack_70);
    pQVar6 = QWidget::geometry(*(QWidget **)(this->ui + 0x18));
    bVar4 = QRect::contains((QPoint *)pQVar6,SUB81(&local_60,0));
    if ((bVar4 & 1) != 0) {
      pQVar1 = *(QPoint **)(this->ui + 0x18);
      QWidget::mapFromParent(pQVar1);
      lVar7 = QListWidget::itemAt(pQVar1);
      if (lVar7 != 0) {
        uVar5 = QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
        QListWidget::insertItems
                  ((int)*(undefined8 *)(this->ui + 0x18),(QList_conflict1 *)(ulong)uVar5);
        pos.xp = 1;
        goto LAB_0018ed06;
      }
    }
    QListWidget::addItems(*(QListWidget **)(this->ui + 0x18),(QStringList *)local_30);
    uVar2 = *(undefined8 *)(this->ui + 0x18);
    QListWidget::count();
    QListWidget::setCurrentRow((int)uVar2);
    updateCurrentItem(this);
    pos.xp = 0;
  }
LAB_0018ed06:
  QList<QString>::~QList((QList<QString> *)local_30);
  return;
}

Assistant:

void MidiPlayerDialog::dropEvent(QDropEvent *e) {
	if (!e->isAccepted()) {
		Master::isSupportedDropEvent(e);
		if (!e->isAccepted()) return;
	}
	QStringList fileNames = Master::parseMidiListFromUrls(e->mimeData()->urls());
	if (fileNames.isEmpty()) {
		e->ignore();
		return;
	}

#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
	const QPoint pos = e->pos();
#else
	const QPoint pos = e->position().toPoint();
#endif
	const bool dropToMidiList = ui->playList->geometry().contains(pos);
	if (dropToMidiList) {
		QListWidgetItem *dropItem = ui->playList->itemAt(ui->playList->mapFromParent(pos));
		if (dropItem != NULL) {
			int dropRow = ui->playList->row(dropItem);
			ui->playList->insertItems(dropRow, fileNames);
			return;
		}
	}
	ui->playList->addItems(fileNames);
	ui->playList->setCurrentRow(ui->playList->count() - 1);
	updateCurrentItem();
}